

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

long mi_option_get_clamp(mi_option_t option,long min,long max)

{
  long lVar1;
  
  if (option < _mi_option_last) {
    if (options[option].init == UNINIT) {
      mi_option_init(options + option);
    }
    lVar1 = options[option].value;
  }
  else {
    lVar1 = 0;
  }
  if (lVar1 < max) {
    max = lVar1;
  }
  if (lVar1 < min) {
    max = min;
  }
  return max;
}

Assistant:

mi_decl_nodiscard long mi_option_get_clamp(mi_option_t option, long min, long max) {
  long x = mi_option_get(option);
  return (x < min ? min : (x > max ? max : x));
}